

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngdec.c
# Opt level: O3

int ExtractMetadataFromPNG
              (png_structp png,png_infop head_info,png_infop end_info,Metadata *metadata)

{
  char *__s1;
  long lVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  long lVar5;
  int *piVar6;
  anon_struct_24_3_f6017608 *paVar7;
  int iVar8;
  png_textp text;
  png_uint_32 len;
  png_bytep profile;
  int comp_type;
  png_charp name;
  int *local_88;
  uint local_80;
  uint local_7c;
  MetadataPayload *local_78;
  png_structp local_70;
  png_infop local_68;
  png_infop local_60;
  png_infop local_58;
  Metadata *local_50;
  char *local_48;
  undefined1 local_3c [4];
  undefined1 local_38 [8];
  
  local_78 = &metadata->iccp;
  uVar4 = CONCAT71((int7)((ulong)local_78 >> 8),1);
  local_70 = png;
  local_68 = head_info;
  local_60 = end_info;
  local_50 = metadata;
  do {
    local_80 = (uint)uVar4;
    local_58 = local_60;
    if ((char)uVar4 != '\0') {
      local_58 = local_68;
    }
    local_88 = (int *)0x0;
    iVar2 = png_get_text(png,local_58,&local_88);
    if (iVar2 != 0) {
      iVar8 = 0;
      do {
        piVar6 = local_88;
        __s1 = *(char **)(local_88 + 2);
        iVar3 = strcmp(__s1,"Raw profile type exif");
        paVar7 = kPNGMetadataMap;
        if (iVar3 != 0) {
          lVar1 = 0;
          do {
            lVar5 = lVar1;
            if (lVar5 + 0x18 == 0x60) goto LAB_001057f4;
            iVar3 = strcmp(__s1,*(char **)((long)&kPNGMetadataMap[1].name + lVar5));
            lVar1 = lVar5 + 0x18;
          } while (iVar3 != 0);
          paVar7 = (anon_struct_24_3_f6017608 *)(lVar5 + 0x1faba8);
        }
        if (*(long *)((long)&(local_50->exif).bytes + paVar7->storage_offset) == 0) {
          iVar3 = (*paVar7->process)(*(char **)(piVar6 + 4),
                                     *(size_t *)(piVar6 + (ulong)(*piVar6 - 1U < 2) * 2 + 6),
                                     (MetadataPayload *)
                                     ((long)&(local_50->exif).bytes + paVar7->storage_offset));
          piVar6 = local_88;
          if (iVar3 == 0) {
            fprintf(stderr,"Failed to process: \'%s\'\n",*(undefined8 *)(local_88 + 2));
            return 0;
          }
        }
        else {
          fprintf(stderr,"Ignoring additional \'%s\'\n",__s1);
          piVar6 = local_88;
        }
LAB_001057f4:
        iVar8 = iVar8 + 1;
        local_88 = piVar6 + 0xe;
      } while (iVar8 != iVar2);
    }
    png = local_70;
    iVar2 = png_get_iCCP(local_70,local_58,local_38,local_3c,&local_48,&local_7c);
    if ((iVar2 == 0x1000) && (iVar2 = MetadataCopy(local_48,(ulong)local_7c,local_78), iVar2 == 0))
    {
      return 0;
    }
    uVar4 = 0;
    if ((local_80 & 1) == 0) {
      return 1;
    }
  } while( true );
}

Assistant:

static int ExtractMetadataFromPNG(png_structp png,
                                  png_infop const head_info,
                                  png_infop const end_info,
                                  Metadata* const metadata) {
  int p;

  for (p = 0; p < 2; ++p)  {
    png_infop const info = (p == 0) ? head_info : end_info;
    png_textp text = NULL;
    const png_uint_32 num = png_get_text(png, info, &text, NULL);
    png_uint_32 i;
    // Look for EXIF / XMP metadata.
    for (i = 0; i < num; ++i, ++text) {
      int j;
      for (j = 0; kPNGMetadataMap[j].name != NULL; ++j) {
        if (!strcmp(text->key, kPNGMetadataMap[j].name)) {
          MetadataPayload* const payload =
              (MetadataPayload*)((uint8_t*)metadata +
                                 kPNGMetadataMap[j].storage_offset);
          png_size_t text_length;
          switch (text->compression) {
#ifdef PNG_iTXt_SUPPORTED
            case PNG_ITXT_COMPRESSION_NONE:
            case PNG_ITXT_COMPRESSION_zTXt:
              text_length = text->itxt_length;
              break;
#endif
            case PNG_TEXT_COMPRESSION_NONE:
            case PNG_TEXT_COMPRESSION_zTXt:
            default:
              text_length = text->text_length;
              break;
          }
          if (payload->bytes != NULL) {
            fprintf(stderr, "Ignoring additional '%s'\n", text->key);
          } else if (!kPNGMetadataMap[j].process(text->text, text_length,
                                                 payload)) {
            fprintf(stderr, "Failed to process: '%s'\n", text->key);
            return 0;
          }
          break;
        }
      }
    }
    // Look for an ICC profile.
    {
      png_charp name;
      int comp_type;
#if LOCAL_PNG_PREREQ(1,5)
      png_bytep profile;
#else
      png_charp profile;
#endif
      png_uint_32 len;

      if (png_get_iCCP(png, info,
                       &name, &comp_type, &profile, &len) == PNG_INFO_iCCP) {
        if (!MetadataCopy((const char*)profile, len, &metadata->iccp)) return 0;
      }
    }
  }
  return 1;
}